

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool updateValueDistribution(double value,HighsValueDistribution *value_distribution)

{
  double dVar1;
  double *pdVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  double in_XMM0_Qa;
  HighsInt i;
  double abs_value;
  int local_24;
  double local_20;
  long local_18;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x40) < 0) {
    local_1 = false;
  }
  else {
    *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
    local_20 = ABS(in_XMM0_Qa);
    local_18 = in_RDI;
    pdVar2 = std::min<double>(&local_20,(double *)(in_RDI + 0x50));
    *(double *)(local_18 + 0x50) = *pdVar2;
    pdVar2 = std::max<double>(&local_20,(double *)(local_18 + 0x58));
    *(double *)(local_18 + 0x58) = *pdVar2;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      if ((local_20 != 1.0) || (NAN(local_20))) {
        for (local_24 = 0; dVar1 = local_20, local_24 < *(int *)(local_18 + 0x40);
            local_24 = local_24 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x60),
                              (long)local_24);
          if (dVar1 < *pvVar3) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_18 + 0x78),
                                (long)local_24);
            *pvVar4 = *pvVar4 + 1;
            return true;
          }
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x78),
                            (long)*(int *)(local_18 + 0x40));
        *pvVar4 = *pvVar4 + 1;
        local_1 = true;
      }
      else {
        *(int *)(local_18 + 0x48) = *(int *)(local_18 + 0x48) + 1;
        local_1 = true;
      }
    }
    else {
      *(int *)(local_18 + 0x44) = *(int *)(local_18 + 0x44) + 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool updateValueDistribution(const double value,
                             HighsValueDistribution& value_distribution) {
  if (value_distribution.num_count_ < 0) return false;
  value_distribution.sum_count_++;
  const double abs_value = fabs(value);
  value_distribution.min_value_ =
      std::min(abs_value, value_distribution.min_value_);
  value_distribution.max_value_ =
      std::max(abs_value, value_distribution.max_value_);
  if (!abs_value) {
    value_distribution.num_zero_++;
    return true;
  }
  if (abs_value == 1.0) {
    value_distribution.num_one_++;
    return true;
  }
  for (HighsInt i = 0; i < value_distribution.num_count_; i++) {
    if (abs_value < value_distribution.limit_[i]) {
      value_distribution.count_[i]++;
      return true;
    }
  }
  value_distribution.count_[value_distribution.num_count_]++;
  return true;
}